

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O2

size_t __thiscall baryonyx::bit_array_hash::operator()(bit_array_hash *this,bit_array *array)

{
  int iVar1;
  underlying_type uVar2;
  int index;
  ulong uVar3;
  
  iVar1 = (array->super_bit_array_impl).m_block_size;
  uVar3 = 0;
  for (index = 0; iVar1 != index; index = index + 1) {
    uVar2 = bit_array_impl::block(&array->super_bit_array_impl,index);
    uVar3 = uVar3 ^ uVar2 + 0x9e3779b9 + (uVar3 >> 2) + uVar3 * 0x40;
  }
  return uVar3;
}

Assistant:

std::size_t operator()(const bit_array& array) const noexcept
    {
        std::size_t ret{ 0 };

        for (int i = 0, e = array.block_size(); i != e; ++i)
            ret ^=
              std::hash<bit_array_impl::underlying_type>()(array.block(i)) +
              0x9e3779b9 + (ret << 6) + (ret >> 2);

        return ret;
    }